

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  uint local_1c;
  int status;
  char **argv_local;
  int argc_local;
  
  bVar1 = crnlib_is_debugger_present();
  if (bVar1) {
    local_1c = main_internal(argc,argv);
  }
  else {
    local_1c = main_internal(argc,argv);
  }
  crnlib::console::printf("\nExit status: %i",(ulong)local_1c);
  bVar1 = check_for_option(argc,argv,"pause");
  if ((bVar1) &&
     ((local_1c == 1 ||
      (uVar2 = crnlib::console::get_num_messages(cErrorConsoleMessage), uVar2 != 0)))) {
    pause_and_wait();
  }
  return local_1c;
}

Assistant:

int main(int argc, char* argv[])
{
    int status = EXIT_FAILURE;

    if (crnlib_is_debugger_present())
    {
        status = main_internal(argc, argv);
    }
    else
    {
#ifdef _MSC_VER
        __try
        {
            status = main_internal(argc, argv);
        }
        __except (EXCEPTION_EXECUTE_HANDLER)
        {
            console::error("Uncached exception! crunch command line tool failed!");
        }
#else
        status = main_internal(argc, argv);
#endif
    }

    console::printf("\nExit status: %i", status);

    if (check_for_option(argc, argv, "pause"))
    {
        if ((status == EXIT_FAILURE) || (console::get_num_messages(cErrorConsoleMessage)))
        {
            pause_and_wait();
        }
    }

    return status;
}